

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.c
# Opt level: O0

void qcc_logger_vprintf(qcc_logger *self,char *fmt,__va_list_tag *args)

{
  char *data;
  undefined1 auStack_38 [8];
  va_list tmp;
  __va_list_tag *args_local;
  char *fmt_local;
  qcc_logger *self_local;
  
  tmp[0].overflow_arg_area = args->reg_save_area;
  auStack_38._0_4_ = args->gp_offset;
  auStack_38._4_4_ = args->fp_offset;
  tmp[0]._0_8_ = args->overflow_arg_area;
  tmp[0].reg_save_area = args;
  data = qcc_arena_vsprintf(self->arena,fmt,(__va_list_tag *)auStack_38);
  _append_message(self,data);
  return;
}

Assistant:

void qcc_logger_vprintf(struct qcc_logger *self, const char *fmt, va_list args)
{
    va_list tmp;
    va_copy(tmp, args);
    _append_message(self, qcc_arena_vsprintf(self->arena, fmt, tmp));
    va_end(tmp);
}